

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O3

void __thiscall liblogger::LogFile::Rotate(LogFile *this)

{
  int iVar1;
  FILE *pFVar2;
  ostream *poVar3;
  LogException *pLVar4;
  int *piVar5;
  char *pcVar6;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((FILE *)this->m_fp != (FILE *)0x0) {
    iVar1 = fclose((FILE *)this->m_fp);
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,"failed to close to file \'",0x19);
      poVar3 = std::operator<<(local_190,(this->m_fname)._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' error:",8);
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      std::operator<<(poVar3,pcVar6);
      pLVar4 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar4,&local_1c0);
      __cxa_throw(pLVar4,&LogException::typeinfo,LogException::~LogException);
    }
  }
  pFVar2 = fopen((this->m_fname)._M_dataplus._M_p,"a");
  this->m_fp = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Cannot open file: \'",0x13);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->m_fname)._M_dataplus._M_p,(this->m_fname)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
  pLVar4 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar4,&local_1c0);
  __cxa_throw(pLVar4,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogFile::Rotate()
{
	if (m_fp != NULL)
	{
		if (fclose(m_fp) < 0)
		{
			std::stringstream ss;
			ss << "failed to close to file '" << m_fname.c_str() << "' error:" << strerror(errno);
			throw(LogException(ss.str()));
		}
	}

	m_fp = fopen(m_fname.c_str(), "a");
	if (m_fp == NULL)
	{
		std::stringstream ss;
		ss << "Cannot open file: '" << m_fname << "'";
		throw(LogException(ss.str()));
	}
}